

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::
dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::dynamic_xpression(dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *this,simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>
                          *matcher)

{
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 *in_RDI;
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>
  *in_stack_ffffffffffffffc8;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>
  *in_stack_ffffffffffffffd0;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>_>,_mpl_::bool_<false>_>
  ::simple_repeat_matcher(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::matchable_ex(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__dynamic_xpression_0021d8d0;
  psVar1 = (shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(in_RDI + 0xd);
  this_00 = get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>();
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::shared_matchable(this_00,psVar1);
  return;
}

Assistant:

dynamic_xpression(Matcher const &matcher = Matcher())
      : Matcher(matcher)
      , next_(get_invalid_xpression<BidiIter>())
    {
    }